

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile,string *config)

{
  undefined8 outputConfig;
  bool bVar1;
  TargetType targetType;
  int iVar2;
  cmGlobalNinjaGenerator *pcVar3;
  cmGeneratorTarget *pcVar4;
  cmMakefile *this_00;
  string *psVar5;
  ulong uVar6;
  cmLocalNinjaGenerator *pcVar7;
  undefined4 extraout_var;
  pointer this_01;
  cmOutputConverter *local_720;
  char *local_658;
  char local_649;
  string local_648;
  cmAlphaNum local_628;
  cmAlphaNum local_5f8;
  string local_5c8;
  char local_5a1;
  char *local_5a0;
  char local_591;
  string local_590;
  cmAlphaNum local_570;
  cmAlphaNum local_540;
  string local_510;
  string local_4f0;
  string local_4d0;
  cmAlphaNum local_4a8;
  cmAlphaNum local_478;
  string local_448;
  string *local_428;
  string *linkCmd;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  cmAlphaNum local_3b8;
  string local_388;
  string *local_368;
  allocator<char> local_359;
  string local_358;
  cmValue local_338;
  cmValue val;
  string launcher;
  string local_308;
  string local_2e8 [8];
  string responseFlag;
  RuleVariables vars;
  string local_168;
  undefined1 local_148 [8];
  cmNinjaRule rule;
  string *config_local;
  bool useResponseFile_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  rule._288_8_ = config;
  LanguageLinkerDeviceRule(&local_168,this,config);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar1 = cmGlobalNinjaGenerator::HasRule(pcVar3,(string *)local_148);
  if (!bVar1) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&responseFlag.field_2 + 8));
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    cmGeneratorTarget::GetName_abi_cxx11_(pcVar4);
    responseFlag.field_2._8_8_ = std::__cxx11::string::c_str();
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    targetType = cmGeneratorTarget::GetType(pcVar4);
    cmState::GetTargetTypeName_abi_cxx11_(targetType);
    std::__cxx11::string::c_str();
    this_00 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG",
               (allocator<char> *)(launcher.field_2._M_local_buf + 0xf));
    psVar5 = cmMakefile::GetSafeDefinition(this_00,&local_308);
    std::__cxx11::string::string(local_2e8,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator((allocator<char> *)(launcher.field_2._M_local_buf + 0xf));
    if ((useResponseFile) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
      std::__cxx11::string::operator=((string *)(rule.DepType.field_2._M_local_buf + 8),"$RSP_FILE")
      ;
      std::__cxx11::string::operator+=(local_2e8,(string *)(rule.DepType.field_2._M_local_buf + 8));
      pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      bVar1 = cmGlobalNinjaGenerator::IsGCCOnWindows(pcVar3);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)(rule.RspFile.field_2._M_local_buf + 8),"$in");
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)(rule.RspFile.field_2._M_local_buf + 8),"$in_newline");
      }
      std::__cxx11::string::operator+=
                ((string *)(rule.RspFile.field_2._M_local_buf + 8)," $LINK_LIBRARIES");
      std::__cxx11::string::c_str();
    }
    std::__cxx11::string::string((string *)&val);
    pcVar7 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar4 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"RULE_LAUNCH_LINK",&local_359);
    local_338 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar7,pcVar4,&local_358);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator(&local_359);
    local_368 = local_338.Value;
    bVar1 = cmNonempty(local_338);
    if (bVar1) {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_338);
      cmAlphaNum::cmAlphaNum(&local_3b8,psVar5);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&rulePlaceholderExpander,' ');
      cmStrCat<>(&local_388,&local_3b8,(cmAlphaNum *)&rulePlaceholderExpander);
      std::__cxx11::string::operator=((string *)&val,(string *)&local_388);
      std::__cxx11::string::~string((string *)&local_388);
    }
    pcVar7 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    iVar2 = (*(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator
              [5])();
    std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
    unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
              ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>
                *)&linkCmds.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (pointer)CONCAT44(extraout_var,iVar2));
    ComputeDeviceLinkCmd_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,this);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    linkCmd = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&linkCmd), bVar1) {
      local_428 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      cmAlphaNum::cmAlphaNum(&local_478,(string *)&val);
      cmAlphaNum::cmAlphaNum(&local_4a8,local_428);
      cmStrCat<>(&local_448,&local_478,&local_4a8);
      std::__cxx11::string::operator=((string *)local_428,(string *)&local_448);
      std::__cxx11::string::~string((string *)&local_448);
      this_01 = std::
                unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                              *)&linkCmds.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar7 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
      local_720 = (cmOutputConverter *)0x0;
      if (pcVar7 != (cmLocalNinjaGenerator *)0x0) {
        local_720 = &(pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                     super_cmOutputConverter;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_01,local_720,local_428,(RuleVariables *)((long)&responseFlag.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    ::cm::
    erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,cmNinjaRemoveNoOpCommands>
              (&__range2);
    pcVar7 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    outputConfig = rule._288_8_;
    std::__cxx11::string::string((string *)&local_4f0);
    cmLocalNinjaGenerator::BuildCommandLine
              (&local_4d0,pcVar7,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,(string *)outputConfig,(string *)outputConfig,&local_4f0,
               (cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=
              ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4f0);
    cmAlphaNum::cmAlphaNum(&local_540,"Rule for linking ");
    TargetLinkLanguage(&local_590,this,(string *)rule._288_8_);
    cmAlphaNum::cmAlphaNum(&local_570,&local_590);
    local_591 = ' ';
    local_5a0 = GetVisibleTypeName(this);
    local_5a1 = '.';
    cmStrCat<char,char_const*,char>
              (&local_510,&local_540,&local_570,&local_591,&local_5a0,&local_5a1);
    std::__cxx11::string::operator=
              ((string *)(rule.Description.field_2._M_local_buf + 8),(string *)&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_590);
    cmAlphaNum::cmAlphaNum(&local_5f8,"Linking ");
    TargetLinkLanguage(&local_648,this,(string *)rule._288_8_);
    cmAlphaNum::cmAlphaNum(&local_628,&local_648);
    local_649 = ' ';
    local_658 = GetVisibleTypeName(this);
    cmStrCat<char,char_const*,char[14]>
              (&local_5c8,&local_5f8,&local_628,&local_649,&local_658,(char (*) [14])0xc7f990);
    std::__cxx11::string::operator=
              ((string *)(rule.Command.field_2._M_local_buf + 8),(string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_648);
    std::__cxx11::string::operator=((string *)(rule.RspContent.field_2._M_local_buf + 8),"$RESTAT");
    pcVar3 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar3,(cmNinjaRule *)local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 *)&linkCmds.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string(local_2e8);
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_148);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkRule(
  bool useResponseFile, const std::string& config)
{
  cmNinjaRule rule(this->LanguageLinkerDeviceRule(config));
  if (!this->GetGlobalGenerator()->HasRule(rule.Name)) {
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType =
      cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType())
        .c_str();

    vars.Language = "CUDA";

    // build response file name
    std::string responseFlag = this->GetMakefile()->GetSafeDefinition(
      "CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG");

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }
      rule.RspContent += " $LINK_LIBRARIES";
      vars.Objects = responseFlag.c_str();
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetPDB = "$TARGET_PDB";
    vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    vars.LanguageCompileFlags = "$LANGUAGE_COMPILE_FLAGS";

    std::string launcher;
    cmValue val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (cmNonempty(val)) {
      launcher = cmStrCat(*val, ' ');
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeDeviceLinkCmd();
    for (std::string& linkCmd : linkCmds) {
      linkCmd = cmStrCat(launcher, linkCmd);
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cm::erase_if(linkCmds, cmNinjaRemoveNoOpCommands());

    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds, config, config);

    // Write the linker rule with response file if needed.
    rule.Comment =
      cmStrCat("Rule for linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), '.');
    rule.Description =
      cmStrCat("Linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), " $TARGET_FILE");
    rule.Restat = "$RESTAT";

    this->GetGlobalGenerator()->AddRule(rule);
  }
}